

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t42objs.c
# Opt level: O0

void T42_Size_Done(FT_Size t42size)

{
  FT_ListNode pFVar1;
  FT_ListNode node;
  T42_Face t42face;
  FT_Face face;
  T42_Size size;
  FT_Size t42size_local;
  
  pFVar1 = FT_List_Find((FT_List)&t42size->face[3].available_sizes[6].size,t42size[1].face);
  if (pFVar1 != (FT_ListNode)0x0) {
    FT_Done_Size((FT_Size)t42size[1].face);
    t42size[1].face = (FT_Face)0x0;
  }
  return;
}

Assistant:

FT_LOCAL_DEF( void )
  T42_Size_Done( FT_Size  t42size )             /* T42_Size */
  {
    T42_Size     size    = (T42_Size)t42size;
    FT_Face      face    = t42size->face;
    T42_Face     t42face = (T42_Face)face;
    FT_ListNode  node;


    node = FT_List_Find( &t42face->ttf_face->sizes_list, size->ttsize );
    if ( node )
    {
      FT_Done_Size( size->ttsize );
      size->ttsize = NULL;
    }
  }